

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

int __thiscall
Fl_PostScript_Graphics_Driver::clip_box
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  int iVar2;
  Clip *pCVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  pCVar3 = this->clip_;
  if ((pCVar3 == (Clip *)0x0) || (pCVar3->w < 0)) {
    *X = x;
    *Y = y;
    *W = w;
    *H = h;
  }
  else {
    iVar1 = pCVar3->x;
    iVar6 = x;
    if (x < iVar1) {
      iVar6 = iVar1;
    }
    *X = iVar6;
    iVar6 = pCVar3->y;
    iVar8 = y;
    if (y < iVar6) {
      iVar8 = iVar6;
    }
    *Y = iVar8;
    iVar4 = w + x;
    iVar9 = pCVar3->w + pCVar3->x;
    iVar8 = iVar9;
    if (iVar4 < iVar9) {
      iVar8 = iVar4;
    }
    iVar5 = *X;
    *W = iVar8 - iVar5;
    if (iVar8 - iVar5 < 0) {
      *W = 0;
    }
    else {
      iVar5 = pCVar3->h + pCVar3->y;
      iVar7 = h + y;
      iVar8 = iVar5;
      if (iVar7 < iVar5) {
        iVar8 = iVar7;
      }
      iVar2 = *Y;
      *H = iVar8 - iVar2;
      if (-1 < iVar8 - iVar2) {
        return (uint)((iVar6 < y || iVar1 < x) || (iVar4 < iVar9 || iVar7 < iVar5));
      }
      *W = 0;
      *H = 0;
    }
  }
  return 1;
}

Assistant:

int Fl_PostScript_Graphics_Driver::clip_box(int x, int y, int w, int h, int &X, int &Y, int &W, int &H){
  if(!clip_){
    X=x;Y=y;W=w;H=h;
    return 1;
  }
  if(clip_->w < 0){
    X=x;Y=y;W=w;H=h;
    return 1;
  }
  int ret=0;
  if (x > (X=clip_->x)) {X=x; ret=1;}
  if (y > (Y=clip_->y)) {Y=y; ret=1;}
  if ((x+w) < (clip_->x+clip_->w)) {
    W=x+w-X;
    
    ret=1;
    
  }else
    W = clip_->x + clip_->w - X;
  if(W<0){
    W=0;
    return 1;
  }
  if ((y+h) < (clip_->y+clip_->h)) {
    H=y+h-Y;
    ret=1;
  }else
    H = clip_->y + clip_->h - Y;
  if(H<0){
    W=0;
    H=0;
    return 1;
  }
  return ret;
}